

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

bool __thiscall
Catch::CompactReporter::assertionEnded(CompactReporter *this,AssertionStats *_assertionStats)

{
  OfType OVar1;
  bool _printInfoMessages;
  int iVar2;
  AssertionPrinter printer;
  AssertionPrinter AStack_58;
  
  iVar2 = (*(((this->super_StreamingReporterBase).m_config.m_p)->super_IShared).super_NonCopyable.
            _vptr_NonCopyable[7])();
  _printInfoMessages = true;
  if (((char)iVar2 != '\0') ||
     (((OVar1 = (_assertionStats->assertionResult).m_resultData.resultType,
       (OVar1 & FailureBit) != Ok &&
       (((_assertionStats->assertionResult).m_info.resultDisposition & SuppressFail) == 0)) ||
      (_printInfoMessages = false, OVar1 == Warning)))) {
    AssertionPrinter::AssertionPrinter
              (&AStack_58,(this->super_StreamingReporterBase).stream,_assertionStats,
               _printInfoMessages);
    AssertionPrinter::print(&AStack_58);
    std::endl<char,std::char_traits<char>>((this->super_StreamingReporterBase).stream);
    std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::~vector
              (&AStack_58.messages);
    _printInfoMessages = true;
  }
  return _printInfoMessages;
}

Assistant:

virtual bool assertionEnded( AssertionStats const& _assertionStats ) {
            AssertionResult const& result = _assertionStats.assertionResult;

            bool printInfoMessages = true;

            // Drop out if result was successful and we're not printing those
            if( !m_config->includeSuccessfulResults() && result.isOk() ) {
                if( result.getResultType() != ResultWas::Warning )
                    return false;
                printInfoMessages = false;
            }

            AssertionPrinter printer( stream, _assertionStats, printInfoMessages );
            printer.print();

            stream << std::endl;
            return true;
        }